

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys1,
               unsigned_long_long *ys2,int count,int offset,int stride)

{
  undefined1 local_70 [8];
  GetterXsYs<unsigned_long_long> getter2;
  GetterXsYs<unsigned_long_long> getter1;
  int offset_local;
  int count_local;
  unsigned_long_long *ys2_local;
  unsigned_long_long *ys1_local;
  unsigned_long_long *xs_local;
  char *label_id_local;
  
  GetterXsYs<unsigned_long_long>::GetterXsYs
            ((GetterXsYs<unsigned_long_long> *)&getter2.Stride,xs,ys1,count,offset,stride);
  GetterXsYs<unsigned_long_long>::GetterXsYs
            ((GetterXsYs<unsigned_long_long> *)local_70,xs,ys2,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYs<unsigned_long_long>>
            (label_id,(GetterXsYs<unsigned_long_long> *)&getter2.Stride,
             (GetterXsYs<unsigned_long_long> *)local_70);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys1, const T* ys2, int count, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys1, count, offset, stride);
    GetterXsYs<T> getter2(xs, ys2, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}